

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChContactTriangleXYZ::ContactableGetStateBlock_x(ChContactTriangleXYZ *this,ChState *x)

{
  double *pdVar1;
  long lVar2;
  element_type *peVar3;
  double *pdVar4;
  Index index_2;
  ulong uVar5;
  uint uVar6;
  Index index_1;
  ulong uVar7;
  
  lVar2 = (x->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (lVar2 < 3) goto LAB_00627ca5;
  pdVar4 = (x->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  peVar3 = (this->mnode1).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  uVar5 = 3;
  if (((ulong)pdVar4 & 7) == 0) {
    uVar6 = -((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar6 < 3) {
      uVar5 = (ulong)uVar6;
    }
    if (uVar6 != 0) goto LAB_00627ba8;
  }
  else {
LAB_00627ba8:
    uVar7 = 0;
    do {
      pdVar4[uVar7] = *(double *)(&(peVar3->super_ChNodeFEAbase).field_0x20 + uVar7 * 8);
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  if (uVar5 < 3) {
    do {
      pdVar4[uVar5] = *(double *)(&(peVar3->super_ChNodeFEAbase).field_0x20 + uVar5 * 8);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 3);
  }
  if (lVar2 < 6) goto LAB_00627ca5;
  peVar3 = (this->mnode2).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar4 + 3;
  uVar5 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar6 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar6 < 3) {
      uVar5 = (ulong)uVar6;
    }
    if (uVar6 != 0) goto LAB_00627c13;
  }
  else {
LAB_00627c13:
    uVar7 = 0;
    do {
      pdVar1[uVar7] = *(double *)(&(peVar3->super_ChNodeFEAbase).field_0x20 + uVar7 * 8);
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  if (uVar5 < 3) {
    do {
      pdVar1[uVar5] = *(double *)(&(peVar3->super_ChNodeFEAbase).field_0x20 + uVar5 * 8);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 3);
  }
  if (lVar2 < 9) {
LAB_00627ca5:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  peVar3 = (this->mnode3).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar4 = pdVar4 + 6;
  uVar5 = 3;
  if (((ulong)pdVar4 & 7) == 0) {
    uVar6 = -((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar6 < 3) {
      uVar5 = (ulong)uVar6;
    }
    if (uVar6 == 0) goto LAB_00627c89;
  }
  uVar7 = 0;
  do {
    pdVar4[uVar7] = *(double *)(&(peVar3->super_ChNodeFEAbase).field_0x20 + uVar7 * 8);
    uVar7 = uVar7 + 1;
  } while (uVar5 != uVar7);
LAB_00627c89:
  if (uVar5 < 3) {
    do {
      pdVar4[uVar5] = *(double *)(&(peVar3->super_ChNodeFEAbase).field_0x20 + uVar5 * 8);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 3);
  }
  return;
}

Assistant:

void ChContactTriangleXYZ::ContactableGetStateBlock_x(ChState& x) {
    x.segment(0, 3) = mnode1->pos.eigen();
    x.segment(3, 3) = mnode2->pos.eigen();
    x.segment(6, 3) = mnode3->pos.eigen();
}